

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateMemberAccess(ExpressionEvalContext *ctx,ExprMemberAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  VariableData *pVVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  TypeRef *pTVar9;
  char *msg;
  _func_int **pp_Var10;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar8 = Evaluate(ctx,expression->value);
      if (pEVar8 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if (pEVar8->typeID == 0xc) {
        pVVar5 = expression->member->variable;
        pp_Var10 = (_func_int **)((ulong)pVVar5->offset + (long)pEVar8[1]._vptr_ExprBase);
        if (*(ulong *)&pEVar8[1].typeID < (ulong)(pVVar5->type->size + (long)pp_Var10)) {
          __assert_fail("ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x62b,
                        "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)"
                       );
        }
        pAVar2 = ctx->ctx->allocator;
        iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,expression->member->variable->type);
        lVar6 = expression->member->variable->type->size;
        pEVar8->typeID = 0xc;
        pEVar8->source = pSVar3;
        pEVar8->type = &pTVar9->super_TypeBase;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223458;
        pEVar8[1]._vptr_ExprBase = pp_Var10;
        *(long *)&pEVar8[1].typeID = (long)pp_Var10 + lVar6;
        if (lVar6 < 0) {
          __assert_fail("ptr <= end",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                        ,0x279,
                        "ExprPointerLiteral::ExprPointerLiteral(SynBase *, TypeBase *, unsigned char *, unsigned char *)"
                       );
        }
        pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
        return pEVar8;
      }
      if (pEVar8->typeID != 9) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x62a,
                      "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)")
        ;
      }
      msg = "ERROR: member access of null pointer";
    }
    else {
      msg = "ERROR: instruction limit reached";
    }
    pEVar8 = (ExprBase *)0x0;
    Report(ctx,msg);
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar3;
    pEVar8->type = pTVar4;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
  }
  return pEVar8;
}

Assistant:

ExprBase* EvaluateMemberAccess(ExpressionEvalContext &ctx, ExprMemberAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: member access of null pointer");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + expression->member->variable->offset;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(expression->member->variable->type), targetPtr, targetPtr + expression->member->variable->type->size);

	return CheckType(expression, shifted);
}